

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall cmFileInstaller::ManifestAppend(cmFileInstaller *this,string *file)

{
  ulong uVar1;
  string local_38 [32];
  string *local_18;
  string *file_local;
  cmFileInstaller *this_local;
  
  local_18 = file;
  file_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&this->Manifest,";");
  }
  std::__cxx11::string::substr((ulong)local_38,(ulong)local_18);
  std::__cxx11::string::operator+=((string *)&this->Manifest,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void ManifestAppend(std::string const& file)
    {
    if (!this->Manifest.empty())
      {
      this->Manifest += ";";
      }
    this->Manifest += file.substr(this->DestDirLength);
    }